

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
ElementsAreMatcherImpl<google::protobuf::Map<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>const&>
::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>*,std::vector<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>>>
          (ElementsAreMatcherImpl<google::protobuf::Map<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>const&>
           *this,__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
          last)

{
  MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_01623578;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>::Matcher
              ((Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                *)&MStack_38,first._M_current);
    std::
    vector<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>
    ::
    emplace_back<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>
              ((vector<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>
                *)(this + 8),
               (Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                *)&MStack_38);
    MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>::
    ~MatcherBase(&MStack_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }